

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void anon_unknown.dwarf_b4209::AssertInt16Equals
               (uint16_t expected,char *s,ParseIntTypeCombo parse_type)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  int line;
  char *pcVar4;
  unsigned_short actual;
  AssertionResult gtest_ar;
  uint16_t local_52;
  Message local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  uint16_t local_32;
  AssertHelper local_30;
  
  local_32 = expected;
  sVar3 = strlen(s);
  pcVar4 = s + sVar3;
  if (parse_type == Both) {
    local_50.ss_.ptr_._0_4_ = 0;
    local_30.data_._0_4_ = wabt::ParseInt16(s,pcVar4,&local_52,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_48,"Result::Ok","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_50,(Result *)&local_30);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      lVar1 = CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x2d;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                (local_48,"expected","actual",&local_32,&local_52);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message(&local_50);
        if (local_40.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x2f;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001e976e:
        local_50.ss_.ptr_._0_4_ = 0;
        local_30.data_._0_4_ = wabt::ParseInt16(s,pcVar4,&local_52,SignedAndUnsigned);
        testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                  (local_48,"Result::Ok",
                   "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                   (Result *)&local_30);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message(&local_50);
          lVar1 = CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_);
          if (s == (char *)0x0) {
            s = "(null)";
            sVar3 = 6;
          }
          else {
            sVar3 = strlen(s);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
          if (local_40.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x38;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                    (local_48,"expected","actual",&local_32,&local_52);
          if (local_48[0] != (internal)0x0) goto LAB_001e9b21;
          testing::Message::Message(&local_50);
          if (local_40.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x3a;
        }
      }
    }
  }
  else {
    local_50.ss_.ptr_._0_4_ = 1;
    local_30.data_._0_4_ = wabt::ParseInt16(s,pcVar4,&local_52,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_48,"Result::Error","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_50,(Result *)&local_30);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      lVar1 = CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x32;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (parse_type - SignedAndUnsigned < 2) goto LAB_001e976e;
      local_50.ss_.ptr_._0_4_ = 1;
      local_30.data_._0_4_ = wabt::ParseInt16(s,pcVar4,&local_52,SignedAndUnsigned);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_48,"Result::Error",
                 "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                 (Result *)&local_30);
      if (local_48[0] != (internal)0x0) goto LAB_001e9b21;
      testing::Message::Message(&local_50);
      lVar1 = CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x3d;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
             ,line,pcVar4);
  testing::internal::AssertHelper::operator=(&local_30,&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (((CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
  }
LAB_001e9b21:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertInt16Equals(uint16_t expected,
                       const char* s,
                       ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt16, parse_type);
}